

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O2

bool duckdb::IntegerCastOperation::HandleDigit<duckdb::IntegerCastData<short>,true>
               (IntegerCastData<short> *state,uint8_t digit)

{
  short sVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  sVar1 = state->result;
  iVar2 = -((-(int)CONCAT71(in_register_00000031,digit) - 0x8000U & 0xffff) / 10);
  if (iVar2 <= sVar1) {
    state->result = sVar1 * 10 - (short)CONCAT71(in_register_00000031,digit);
  }
  return iVar2 <= sVar1;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		using store_t = typename T::StoreType;
		if (NEGATIVE) {
			if (DUCKDB_UNLIKELY(state.result < (NumericLimits<store_t>::Minimum() + digit) / 10)) {
				return false;
			}
			state.result = UnsafeNumericCast<store_t>(state.result * 10 - digit);
		} else {
			if (DUCKDB_UNLIKELY(state.result > (NumericLimits<store_t>::Maximum() - digit) / 10)) {
				return false;
			}
			state.result = UnsafeNumericCast<store_t>(state.result * 10 + digit);
		}
		return true;
	}